

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_ahostop(compiler_state_t *cstate,u_char *eaddr,int dir)

{
  block *pbVar1;
  block *pbVar2;
  block *b1;
  block *b0;
  int dir_local;
  u_char *eaddr_local;
  compiler_state_t *cstate_local;
  
  switch(dir) {
  case 0:
  case 3:
    pbVar1 = gen_ahostop(cstate,eaddr,1);
    pbVar2 = gen_ahostop(cstate,eaddr,2);
    gen_or(pbVar1,pbVar2);
    return pbVar2;
  case 1:
    pbVar1 = gen_bcmp(cstate,OR_LINKHDR,0,1,eaddr);
    return pbVar1;
  case 2:
    pbVar1 = gen_bcmp(cstate,OR_LINKHDR,1,1,eaddr);
    return pbVar1;
  case 4:
    pbVar1 = gen_ahostop(cstate,eaddr,1);
    pbVar2 = gen_ahostop(cstate,eaddr,2);
    gen_and(pbVar1,pbVar2);
    return pbVar2;
  case 5:
    bpf_error(cstate,"\'addr1\' is only supported on 802.11");
    break;
  case 6:
    bpf_error(cstate,"\'addr2\' is only supported on 802.11");
    break;
  case 7:
    bpf_error(cstate,"\'addr3\' is only supported on 802.11");
    break;
  case 8:
    bpf_error(cstate,"\'addr4\' is only supported on 802.11");
    break;
  case 9:
    bpf_error(cstate,"\'ra\' is only supported on 802.11");
    break;
  case 10:
    bpf_error(cstate,"\'ta\' is only supported on 802.11");
  }
  abort();
}

Assistant:

static struct block *
gen_ahostop(compiler_state_t *cstate, const u_char *eaddr, int dir)
{
	register struct block *b0, *b1;

	switch (dir) {
	/* src comes first, different from Ethernet */
	case Q_SRC:
		return gen_bcmp(cstate, OR_LINKHDR, 0, 1, eaddr);

	case Q_DST:
		return gen_bcmp(cstate, OR_LINKHDR, 1, 1, eaddr);

	case Q_AND:
		b0 = gen_ahostop(cstate, eaddr, Q_SRC);
		b1 = gen_ahostop(cstate, eaddr, Q_DST);
		gen_and(b0, b1);
		return b1;

	case Q_DEFAULT:
	case Q_OR:
		b0 = gen_ahostop(cstate, eaddr, Q_SRC);
		b1 = gen_ahostop(cstate, eaddr, Q_DST);
		gen_or(b0, b1);
		return b1;

	case Q_ADDR1:
		bpf_error(cstate, "'addr1' is only supported on 802.11");
		break;

	case Q_ADDR2:
		bpf_error(cstate, "'addr2' is only supported on 802.11");
		break;

	case Q_ADDR3:
		bpf_error(cstate, "'addr3' is only supported on 802.11");
		break;

	case Q_ADDR4:
		bpf_error(cstate, "'addr4' is only supported on 802.11");
		break;

	case Q_RA:
		bpf_error(cstate, "'ra' is only supported on 802.11");
		break;

	case Q_TA:
		bpf_error(cstate, "'ta' is only supported on 802.11");
		break;
	}
	abort();
	/* NOTREACHED */
}